

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::get_common_basic_type
          (Compiler *this,SPIRType *type,BaseType *base_type)

{
  size_t sVar1;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar2;
  bool bVar3;
  undefined8 in_RAX;
  SPIRType *pSVar4;
  long lVar5;
  bool bVar6;
  BaseType member_base;
  undefined8 uStack_38;
  
  if (type->basetype == Struct) {
    *base_type = Unknown;
    sVar1 = (type->member_types).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
            buffer_size;
    bVar6 = sVar1 == 0;
    if (!bVar6) {
      pTVar2 = (type->member_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr;
      uStack_38 = in_RAX;
      pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          pTVar2->id);
      bVar3 = get_common_basic_type(this,pSVar4,(BaseType *)((long)&uStack_38 + 4));
      if (bVar3) {
        lVar5 = 4;
        do {
          if (*base_type == Unknown) {
            *base_type = uStack_38._4_4_;
          }
          else if (*base_type != uStack_38._4_4_) {
            return bVar6;
          }
          bVar6 = sVar1 << 2 == lVar5;
          if (bVar6) {
            return bVar6;
          }
          pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                             ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              *(uint *)((long)&pTVar2->id + lVar5));
          bVar3 = get_common_basic_type(this,pSVar4,(BaseType *)((long)&uStack_38 + 4));
          lVar5 = lVar5 + 4;
        } while (bVar3);
      }
    }
  }
  else {
    *base_type = type->basetype;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool Compiler::get_common_basic_type(const SPIRType &type, SPIRType::BaseType &base_type)
{
	if (type.basetype == SPIRType::Struct)
	{
		base_type = SPIRType::Unknown;
		for (auto &member_type : type.member_types)
		{
			SPIRType::BaseType member_base;
			if (!get_common_basic_type(get<SPIRType>(member_type), member_base))
				return false;

			if (base_type == SPIRType::Unknown)
				base_type = member_base;
			else if (base_type != member_base)
				return false;
		}
		return true;
	}
	else
	{
		base_type = type.basetype;
		return true;
	}
}